

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_icdf<trng::powerlaw_dist<long_double>>(powerlaw_dist<long_double> *d)

{
  unkbyte10 Var1;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> __first;
  StringRef capturedExpression;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  bool bVar2;
  reference pvVar3;
  reference plVar4;
  int iVar5;
  undefined8 in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar7;
  longdouble in_ST6;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  AssertionHandler catchAssertionHandler;
  result_type y;
  result_type x;
  longdouble p;
  iterator __end0;
  iterator __begin0;
  vector<long_double,_std::allocator<long_double>_> *__range1;
  int i;
  vector<long_double,_std::allocator<long_double>_> p_values;
  longdouble eps;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar8;
  Flags in_stack_fffffffffffffdec;
  undefined4 uVar9;
  undefined2 in_stack_fffffffffffffdf0;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffffdf2;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffe00;
  undefined6 in_stack_fffffffffffffe02;
  ExprLhs<const_long_double_&> in_stack_fffffffffffffe08;
  SourceLineInfo *this;
  ExprLhs<const_long_double_&> *this_00;
  undefined2 in_stack_fffffffffffffe20;
  undefined2 in_stack_fffffffffffffe22;
  undefined2 in_stack_fffffffffffffe2e;
  undefined1 *puVar11;
  powerlaw_dist<long_double> *in_stack_fffffffffffffe38;
  powerlaw_dist<long_double> *this_01;
  SourceLineInfo local_140;
  StringRef local_130;
  undefined1 local_120 [72];
  longdouble local_d8;
  longdouble local_b8;
  longdouble *local_a0;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> local_98
  ;
  undefined1 *local_90;
  longdouble *local_88;
  longdouble *local_80;
  longdouble local_78;
  longdouble local_68;
  int local_58;
  longdouble local_48;
  undefined1 local_30 [40];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::numeric_limits<long_double>::epsilon();
  local_30._24_10_ = (longdouble)256.0 * in_ST0;
  this_01 = (powerlaw_dist<long_double> *)local_30;
  lVar6 = in_ST6;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x370ff5);
  local_48 = (longdouble)0.5;
  std::vector<long_double,_std::allocator<long_double>_>::push_back
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
             (value_type_conflict7 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  for (local_58 = 2; local_58 < 0x40; local_58 = local_58 + 1) {
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)local_30,0);
    Var1 = *(unkbyte10 *)pvVar3;
    uVar8 = (undefined4)Var1;
    uVar9 = (undefined4)((unkuint10)Var1 >> 0x20);
    uVar10 = (undefined2)((unkuint10)Var1 >> 0x40);
    lVar7 = in_ST6;
    std::pow(__x,in_XMM1_Qa);
    local_68 = (longdouble)0 + in_ST1;
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffdf2,uVar10),
               (value_type_conflict7 *)CONCAT44(uVar9,uVar8));
    in_stack_fffffffffffffe38 = (powerlaw_dist<long_double> *)local_30;
    pvVar3 = std::vector<long_double,_std::allocator<long_double>_>::operator[]
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        in_stack_fffffffffffffe38,0);
    Var1 = *(unkbyte10 *)pvVar3;
    in_stack_fffffffffffffdf8._M_current = SUB108((longdouble)local_58,0);
    in_stack_fffffffffffffe00 = (undefined2)((unkuint10)(longdouble)local_58 >> 0x40);
    in_stack_fffffffffffffde8 = (undefined4)Var1;
    in_stack_fffffffffffffdec = (Flags)((unkuint10)Var1 >> 0x20);
    in_stack_fffffffffffffdf0 = (undefined2)((unkuint10)Var1 >> 0x40);
    in_ST1 = in_ST3;
    in_ST3 = in_ST5;
    in_ST5 = lVar7;
    std::pow(__x_00,in_XMM1_Qa);
    local_78 = (longdouble)1 - in_ST2;
    lVar6 = lVar7;
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
               (value_type_conflict7 *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)
              );
    in_ST2 = in_ST4;
    in_ST4 = in_ST6;
    in_ST6 = lVar7;
  }
  puVar11 = local_30;
  local_80 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::begin
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_88 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::end
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  __first._M_current._2_6_ = in_stack_fffffffffffffe02;
  __first._M_current._0_2_ = in_stack_fffffffffffffe00;
  std::
  sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            (__first,in_stack_fffffffffffffdf8);
  local_90 = local_30;
  local_98._M_current =
       (longdouble *)
       std::vector<long_double,_std::allocator<long_double>_>::begin
                 ((vector<long_double,_std::allocator<long_double>_> *)
                  CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_a0 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::end
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                        *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                       (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (!bVar2) break;
    plVar4 = __gnu_cxx::
             __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
             ::operator*(&local_98);
    local_b8 = *plVar4;
    x_01._8_8_ = in_stack_fffffffffffffe38;
    x_01._0_8_ = puVar11;
    lVar7 = lVar6;
    trng::powerlaw_dist<long_double>::icdf(this_01,(result_type_conflict3)x_01);
    iVar5 = (int)local_8;
    x_00._2_2_ = in_stack_fffffffffffffe22;
    x_00._0_2_ = in_stack_fffffffffffffe20;
    x_00._4_10_ = in_ST1;
    x_00._14_2_ = in_stack_fffffffffffffe2e;
    in_ST1 = in_ST4;
    in_ST4 = lVar6;
    trng::powerlaw_dist<long_double>::cdf(in_stack_fffffffffffffe38,(result_type_conflict3)x_00);
    this_00 = SUB108(in_ST2,0);
    in_stack_fffffffffffffe20 = (undefined2)((unkuint10)in_ST2 >> 0x40);
    lVar6 = in_ST2 - local_b8;
    in_stack_fffffffffffffde8 = SUB104(lVar6,0);
    in_stack_fffffffffffffdec = (Flags)((unkuint10)lVar6 >> 0x20);
    in_stack_fffffffffffffdf0 = (undefined2)((unkuint10)lVar6 >> 0x40);
    lVar6 = in_ST5;
    in_ST5 = lVar7;
    local_d8 = in_ST2;
    std::abs(iVar5);
    in_ST2 = lVar6;
    lVar6 = lVar7;
    if ((longdouble)2.7755576e-17 <= in_ST3) {
      local_130 = operator____catch_sr
                            ((char *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      this = &local_140;
      Catch::SourceLineInfo::SourceLineInfo
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
                 ,0xa8);
      Catch::StringRef::StringRef
                ((StringRef *)CONCAT62(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00),
                 (char *)in_stack_fffffffffffffdf8._M_current);
      iVar5 = (int)local_120;
      capturedExpression.m_size = (size_type)this;
      capturedExpression.m_start = (char *)in_stack_fffffffffffffe08.m_lhs;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00),
                 (StringRef *)in_stack_fffffffffffffdf8._M_current,
                 (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                 capturedExpression,in_stack_fffffffffffffdec);
      local_d8 = local_d8 - local_b8;
      in_stack_fffffffffffffde8 = SUB104(local_d8,0);
      in_stack_fffffffffffffdec = (Flags)((unkuint10)local_d8 >> 0x20);
      in_stack_fffffffffffffdf0 = (undefined2)((unkuint10)local_d8 >> 0x40);
      in_ST1 = in_ST2;
      in_ST2 = in_ST6;
      in_ST6 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar7;
      lVar6 = lVar7;
      std::abs(iVar5);
      in_stack_fffffffffffffe08 =
           Catch::Decomposer::operator<=
                     ((Decomposer *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      (longdouble *)0x3712ee);
      Catch::ExprLhs<long_double_const&>::operator<(this_00,(longdouble *)this);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                 (ITransientExpression *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      Catch::BinaryExpr<const_long_double_&,_const_long_double_&>::~BinaryExpr
                ((BinaryExpr<const_long_double_&,_const_long_double_&> *)0x371345);
      Catch::AssertionHandler::complete
                ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0));
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0));
    }
    __gnu_cxx::
    __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>::
    operator++(&local_98);
    in_ST3 = in_ST6;
    in_ST6 = lVar7;
  }
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)
             CONCAT62(in_stack_fffffffffffffe02,in_stack_fffffffffffffe00));
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}